

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

bool __thiscall
PartiallySignedTransaction::AddInput(PartiallySignedTransaction *this,CTxIn *txin,PSBTInput *psbtin)

{
  uint uVar1;
  long lVar2;
  CTxIn *pCVar3;
  size_type new_capacity;
  __normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> _Var4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<CTxIn*,std::vector<CTxIn,std::allocator<CTxIn>>>,__gnu_cxx::__ops::_Iter_equals_val<CTxIn_const>>
                    (*(undefined8 *)
                      &(this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                       .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                       super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin,
                     *(pointer *)
                      ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vin + 8),txin);
  pCVar3 = *(pointer *)
            ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                    super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                    super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8);
  if (_Var4._M_current == pCVar3) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)this,txin);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::clear(&(psbtin->partial_sigs)._M_t);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
              (&(psbtin->final_script_sig).super_CScriptBase,0);
    uVar1 = (psbtin->final_script_sig).super_CScriptBase._size;
    new_capacity = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      new_capacity = uVar1;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
              (&(psbtin->final_script_sig).super_CScriptBase,new_capacity);
    CScriptWitness::SetNull(&psbtin->final_script_witness);
    std::vector<PSBTInput,_std::allocator<PSBTInput>_>::push_back(&this->inputs,psbtin);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return _Var4._M_current == pCVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallySignedTransaction::AddInput(const CTxIn& txin, PSBTInput& psbtin)
{
    if (std::find(tx->vin.begin(), tx->vin.end(), txin) != tx->vin.end()) {
        return false;
    }
    tx->vin.push_back(txin);
    psbtin.partial_sigs.clear();
    psbtin.final_script_sig.clear();
    psbtin.final_script_witness.SetNull();
    inputs.push_back(psbtin);
    return true;
}